

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PNM_Image.cxx
# Opt level: O2

void __thiscall Fl_PNM_Image::Fl_PNM_Image(Fl_PNM_Image *this,char *name)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  FILE *__stream;
  long lVar6;
  uchar *puVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  int val;
  Fl_PNM_Image *local_460;
  char *local_458;
  long local_450;
  char *local_448;
  ulong local_440;
  char line [1024];
  
  Fl_RGB_Image::Fl_RGB_Image(&this->super_Fl_RGB_Image,(uchar *)0x0,0,0,3,0);
  (this->super_Fl_RGB_Image).super_Fl_Image._vptr_Fl_Image =
       (_func_int **)&PTR__Fl_RGB_Image_0027bbf8;
  local_460 = this;
  __stream = (FILE *)fl_fopen(name,"rb");
  if (__stream != (FILE *)0x0) {
    local_458 = fgets(line,0x400,__stream);
    if (local_458 != (char *)0x0) {
      local_448 = name;
      iVar4 = atoi(local_458 + 1);
      do {
        pcVar1 = local_458 + 1;
        local_458 = local_458 + 1;
      } while ((int)*pcVar1 - 0x30U < 10);
      if (iVar4 == 7) {
        local_458 = "";
      }
      while ((local_458 != (char *)0x0 && ((local_460->super_Fl_RGB_Image).super_Fl_Image.w_ == 0)))
      {
        cVar2 = *local_458;
        if ((cVar2 == '#') || (cVar2 == '\0')) {
          local_458 = fgets(line,0x400,__stream);
        }
        else if ((int)cVar2 - 0x30U < 10) {
          lVar6 = strtol(local_458,&local_458,10);
          (local_460->super_Fl_RGB_Image).super_Fl_Image.w_ = (int)lVar6;
        }
        else {
          local_458 = local_458 + 1;
        }
      }
      while ((local_458 != (char *)0x0 && ((local_460->super_Fl_RGB_Image).super_Fl_Image.h_ == 0)))
      {
        cVar2 = *local_458;
        if ((cVar2 == '#') || (cVar2 == '\0')) {
          local_458 = fgets(line,0x400,__stream);
        }
        else if ((int)cVar2 - 0x30U < 10) {
          lVar6 = strtol(local_458,&local_458,10);
          (local_460->super_Fl_RGB_Image).super_Fl_Image.h_ = (int)lVar6;
        }
        else {
          local_458 = local_458 + 1;
        }
      }
      local_450 = 1;
      if ((iVar4 != 1) && (iVar4 != 4)) {
        local_450 = 0;
        while ((local_458 != (char *)0x0 && ((int)local_450 == 0))) {
          cVar2 = *local_458;
          if ((cVar2 == '#') || (cVar2 == '\0')) {
            local_458 = fgets(line,0x400,__stream);
            local_450 = 0;
          }
          else if ((int)cVar2 - 0x30U < 10) {
            local_450 = strtol(local_458,&local_458,10);
          }
          else {
            local_458 = local_458 + 1;
            local_450 = 0;
          }
        }
      }
      uVar5 = 3;
      uVar11 = iVar4 - 1;
      local_440 = (ulong)uVar11;
      if (uVar11 < 5) {
        uVar5 = *(uint *)(&DAT_0023bc30 + (ulong)uVar11 * 4);
      }
      (local_460->super_Fl_RGB_Image).super_Fl_Image.d_ = uVar5;
      iVar4 = (local_460->super_Fl_RGB_Image).super_Fl_Image.w_;
      iVar9 = (local_460->super_Fl_RGB_Image).super_Fl_Image.h_;
      uVar10 = (ulong)iVar9;
      uVar8 = (ulong)uVar5 * uVar10 * (long)iVar4;
      if (Fl_RGB_Image::max_size_ <= uVar8 && uVar8 - Fl_RGB_Image::max_size_ != 0) {
        (*Fl::warning)("PNM file \"%s\" is too large!\n",local_448);
        fclose(__stream);
        (local_460->super_Fl_RGB_Image).super_Fl_Image.w_ = 0;
        (local_460->super_Fl_RGB_Image).super_Fl_Image.h_ = 0;
        (local_460->super_Fl_RGB_Image).super_Fl_Image.d_ = 0;
        (local_460->super_Fl_RGB_Image).super_Fl_Image.ld_ = -3;
        return;
      }
      puVar7 = (uchar *)operator_new__((long)(int)(iVar4 * iVar9 * uVar5));
      (local_460->super_Fl_RGB_Image).array = puVar7;
      (local_460->super_Fl_RGB_Image).alloc_array = 1;
      iVar4 = 0;
      while (iVar4 < (int)uVar10) {
        local_448 = (char *)CONCAT44(local_448._4_4_,iVar4);
        if ((uint)local_440 < 7) {
          iVar9 = (local_460->super_Fl_RGB_Image).super_Fl_Image.w_;
          iVar3 = (local_460->super_Fl_RGB_Image).super_Fl_Image.d_;
          iVar12 = iVar3 * iVar9;
          puVar7 = (local_460->super_Fl_RGB_Image).array + iVar12 * iVar4;
          switch((long)&switchD_002069e7::switchdataD_0023bc14 +
                 (long)(int)(&switchD_002069e7::switchdataD_0023bc14)[local_440]) {
          case 0x2069e9:
            if ((int)(uint)local_450 < 0x100) {
              fread(puVar7,(long)iVar9,(long)iVar3,__stream);
            }
            else {
              for (; 0 < iVar12; iVar12 = iVar12 + -1) {
                uVar5 = getc(__stream);
                val = uVar5 & 0xff;
                uVar11 = val << 8;
                uVar5 = getc(__stream);
                val = uVar5 & 0xff | uVar11;
                *puVar7 = (uchar)((uint)(val * 0xff) / (uint)local_450);
                puVar7 = puVar7 + 1;
              }
            }
            break;
          case 0x206a97:
            for (; 0 < iVar9; iVar9 = iVar9 + -1) {
              uVar5 = getc(__stream);
              *puVar7 = (uchar)(((uVar5 >> 5 & 7) * 0xff) / 7);
              puVar7[1] = (uchar)(((uVar5 >> 2 & 7) * 0xff) / 7);
              puVar7[2] = ((byte)uVar5 & 3) * 'U';
              puVar7 = puVar7 + 3;
            }
            break;
          case 0x206ac7:
            for (; 0 < iVar9; iVar9 = iVar9 + -1) {
              iVar4 = __isoc99_fscanf(__stream,"%d",&val);
              if (iVar4 == 1) {
                *puVar7 = (char)val + 0xff;
                puVar7 = puVar7 + 1;
              }
            }
            break;
          case 0x206afe:
            for (; 0 < iVar9; iVar9 = iVar9 + -1) {
              iVar4 = __isoc99_fscanf(__stream,"%d",&val);
              if (iVar4 == 1) {
                *puVar7 = (uchar)((val * 0xff) / (int)(uint)local_450);
                puVar7 = puVar7 + 1;
              }
            }
            break;
          case 0x206b8d:
            for (; 0 < iVar9; iVar9 = iVar9 + -1) {
              iVar4 = __isoc99_fscanf(__stream,"%d",&val);
              if (iVar4 == 1) {
                *puVar7 = (uchar)((val * 0xff) / (int)(uint)local_450);
                puVar7 = puVar7 + 1;
              }
              iVar4 = __isoc99_fscanf(__stream,"%d",&val);
              if (iVar4 == 1) {
                *puVar7 = (uchar)((val * 0xff) / (int)(uint)local_450);
                puVar7 = puVar7 + 1;
              }
              iVar4 = __isoc99_fscanf(__stream,"%d",&val);
              if (iVar4 == 1) {
                *puVar7 = (uchar)((val * 0xff) / (int)(uint)local_450);
                puVar7 = puVar7 + 1;
              }
            }
            break;
          case 0x206ba8:
            uVar5 = getc(__stream);
            uVar11 = 0x80;
            for (; 0 < iVar9; iVar9 = iVar9 + -1) {
              *puVar7 = -((uVar5 & 0xff & uVar11) == 0);
              if (uVar11 < 2) {
                uVar11 = 0x80;
                if (iVar9 != 1) {
                  uVar5 = getc(__stream);
                }
              }
              else {
                uVar11 = uVar11 >> 1;
              }
              puVar7 = puVar7 + 1;
            }
          }
        }
        uVar10 = (ulong)(uint)(local_460->super_Fl_RGB_Image).super_Fl_Image.h_;
        iVar4 = (int)local_448 + 1;
      }
      fclose(__stream);
      return;
    }
    fclose(__stream);
    (*Fl::error)("Early end-of-file in PNM file \"%s\"!",name);
  }
  (local_460->super_Fl_RGB_Image).super_Fl_Image.ld_ = -2;
  return;
}

Assistant:

Fl_PNM_Image::Fl_PNM_Image(const char *name)	// I - File to read
  : Fl_RGB_Image(0,0,0) {
  FILE		*fp;		// File pointer
  int		x, y;		// Looping vars
  char		line[1024],	// Input line
		*lineptr;	// Pointer in line
  uchar		*ptr,		// Pointer to pixel values
		byte,		// Byte from file
		bit;		// Bit in pixel
  int		format,		// Format of PNM file
		val,		// Pixel value
		maxval;		// Maximum pixel value


  if ((fp = fl_fopen(name, "rb")) == NULL) {
    ld(ERR_FILE_ACCESS);
    return;
  }

  //
  // Read the file header in the format:
  //
  //   Pformat
  //   # comment1
  //   # comment2
  //   ...
  //   # commentN
  //   width
  //   height
  //   max sample
  //

  lineptr = fgets(line, sizeof(line), fp);
  if (!lineptr) {
    fclose(fp);
    Fl::error("Early end-of-file in PNM file \"%s\"!", name);
    ld(ERR_FILE_ACCESS);
    return;
  }

  lineptr ++;

  format = atoi(lineptr);
  while (isdigit(*lineptr)) lineptr ++;

  if (format == 7) lineptr = (char *)"";

  while (lineptr != NULL && w() == 0) {
    if (*lineptr == '\0' || *lineptr == '#') {
      lineptr = fgets(line, sizeof(line), fp);
    } else if (isdigit(*lineptr)) {
      w(strtol(lineptr, &lineptr, 10));
    } else lineptr ++;
  }

  while (lineptr != NULL && h() == 0) {
    if (*lineptr == '\0' || *lineptr == '#') {
      lineptr = fgets(line, sizeof(line), fp);
    } else if (isdigit(*lineptr)) {
      h(strtol(lineptr, &lineptr, 10));
    } else lineptr ++;
  }

  if (format != 1 && format != 4) {
    maxval = 0;

    while (lineptr != NULL && maxval == 0) {
      if (*lineptr == '\0' || *lineptr == '#') {
	lineptr = fgets(line, sizeof(line), fp);
      } else if (isdigit(*lineptr)) {
	maxval = strtol(lineptr, &lineptr, 10);
      } else lineptr ++;
    }
  } else maxval = 1;

  // Allocate memory...
  if (format == 1 || format == 2 || format == 4 || format == 5) d(1);
  else d(3);

//  printf("%s = %dx%dx%d\n", name, w(), h(), d());

  if (((size_t)w()) * h() * d() > max_size() ) {
    Fl::warning("PNM file \"%s\" is too large!\n", name);
    fclose(fp);
    w(0); h(0); d(0); ld(ERR_FORMAT);
    return;
  }
  array       = new uchar[w() * h() * d()];
  alloc_array = 1;

  // Read the image file...
  for (y = 0; y < h(); y ++) {
    ptr = (uchar *)array + y * w() * d();

    switch (format) {
      case 1 :
        for (x = w(); x > 0; x --)
          if (fscanf(fp, "%d", &val) == 1) *ptr++ = (uchar)(255 * (1-val));
        break;
        
      case 2 :
          for (x = w(); x > 0; x --)
            if (fscanf(fp, "%d", &val) == 1) *ptr++ = (uchar)(255 * val / maxval);
          break;

      case 3 :
          for (x = w(); x > 0; x --) {
            if (fscanf(fp, "%d", &val) == 1) *ptr++ = (uchar)(255 * val / maxval);
            if (fscanf(fp, "%d", &val) == 1) *ptr++ = (uchar)(255 * val / maxval);
            if (fscanf(fp, "%d", &val) == 1) *ptr++ = (uchar)(255 * val / maxval);
          }
          break;

      case 4 :
        for (x = w(), byte = (uchar)getc(fp), bit = 128; x > 0; x --) {
          if ((byte & bit) == 0) *ptr++ = 255; // 0 bit for white pixel
          else *ptr++ = 0; // 1 bit for black pixel
          
          if (bit > 1) bit >>= 1;
          else {
            bit  = 128;
            if (x > 1) byte = (uchar)getc(fp);
          }
        }
        break;
          
      case 5 :
      case 6 :
        if (maxval < 256) {
          if (fread(ptr, w(), d(), fp)) { /* ignored */ }
        } else {
          for (x = d() * w(); x > 0; x --) {
            val = (uchar)getc(fp);
            val = (val<<8)|(uchar)getc(fp);
            *ptr++ = (255*val)/maxval;
          }
        }
        break;
        
      case 7 : /* XV 3:3:2 thumbnail format */
        for (x = w(); x > 0; x --) {
          byte = (uchar)getc(fp);
          
          *ptr++ = (uchar)(255 * ((byte >> 5) & 7) / 7);
          *ptr++ = (uchar)(255 * ((byte >> 2) & 7) / 7);
          *ptr++ = (uchar)(255 * (byte & 3) / 3);
        }
        break;
    }
  }

  fclose(fp);
}